

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O0

ValuedAction despot::POMCP::OptimalAction(VNode *vnode)

{
  int _action;
  ulong uVar1;
  size_type sVar2;
  const_reference ppQVar3;
  double dVar4;
  ValuedAction VVar5;
  VNode *local_40;
  double local_38;
  int local_2c;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *pvStack_28;
  ACT_TYPE action;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *qnodes;
  VNode *vnode_local;
  ValuedAction astar;
  
  qnodes = (vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *)vnode;
  pvStack_28 = VNode::children(vnode);
  ValuedAction::ValuedAction((ValuedAction *)&vnode_local,-1,-INFINITY);
  local_2c = 0;
  while( true ) {
    uVar1 = (ulong)local_2c;
    sVar2 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(pvStack_28);
    if (sVar2 <= uVar1) break;
    ppQVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                        (pvStack_28,(long)local_2c);
    dVar4 = QNode::value(*ppQVar3);
    _action = local_2c;
    if ((double)astar._0_8_ < dVar4) {
      ppQVar3 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                          (pvStack_28,(long)local_2c);
      dVar4 = QNode::value(*ppQVar3);
      ValuedAction::ValuedAction((ValuedAction *)&local_40,_action,dVar4);
      vnode_local = local_40;
      astar._0_8_ = local_38;
    }
    local_2c = local_2c + 1;
  }
  VVar5._0_8_ = (ulong)vnode_local & 0xffffffff;
  VVar5.value = (double)astar._0_8_;
  return VVar5;
}

Assistant:

ValuedAction POMCP::OptimalAction(const VNode* vnode) {
	const vector<QNode*>& qnodes = vnode->children();
	ValuedAction astar(-1, Globals::NEG_INFTY);
	for (ACT_TYPE action = 0; action < qnodes.size(); action++) {
		// cout << action << " " << qnodes[action]->value() << " " << qnodes[action]->count() << " " << vnode->count() << endl;
		if (qnodes[action]->value() > astar.value) {
			astar = ValuedAction(action, qnodes[action]->value());
		}
	}
	// assert(atar.action != -1);
	return astar;
}